

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

void Abc_NtkDontCareWinSweepLeafTfo_rec(Abc_Obj_t *pObj,int nLevelLimit,Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_2c;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode_local;
  int nLevelLimit_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsCo(pObj);
  if ((((iVar1 == 0) && ((int)(*(uint *)&pObj->field_0x14 >> 0xc) <= nLevelLimit)) &&
      (pObj != pNode)) && (iVar1 = Abc_NodeIsTravIdCurrent(pObj), iVar1 == 0)) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar1 = Abc_ObjFanoutNum(pObj);
    if (iVar1 < 0x65) {
      for (local_2c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_2c < iVar1; local_2c = local_2c + 1)
      {
        pObj_00 = Abc_ObjFanout(pObj,local_2c);
        Abc_NtkDontCareWinSweepLeafTfo_rec(pObj_00,nLevelLimit,pNode);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkDontCareWinSweepLeafTfo_rec( Abc_Obj_t * pObj, int nLevelLimit, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout;
    int i;
    if ( Abc_ObjIsCo(pObj) || (int)pObj->Level > nLevelLimit || pObj == pNode )
        return;
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    ////////////////////////////////////////
    // try to reduce the runtime
    if ( Abc_ObjFanoutNum(pObj) > 100 )
        return;
    ////////////////////////////////////////
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Abc_NtkDontCareWinSweepLeafTfo_rec( pFanout, nLevelLimit, pNode );
}